

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laswriteitemcompressed_v4.cpp
# Opt level: O1

int __thiscall
LASwriteItemCompressed_BYTE14_v4::init(LASwriteItemCompressed_BYTE14_v4 *this,EVP_PKEY_CTX *ctx)

{
  U32 context;
  ByteStreamOutArray **ppBVar1;
  ByteStreamOutArray *pBVar2;
  U8 *pUVar3;
  ArithmeticEncoder **ppAVar4;
  ArithmeticEncoder *this_00;
  size_t __n;
  long lVar5;
  undefined7 extraout_var;
  U32 *in_RDX;
  ulong uVar6;
  ulong uVar7;
  
  uVar6 = (ulong)this->number;
  if (this->outstream_Bytes == (ByteStreamOutArray **)0x0) {
    ppBVar1 = (ByteStreamOutArray **)operator_new__(uVar6 * 8);
    this->outstream_Bytes = ppBVar1;
    if (uVar6 != 0) {
      uVar7 = 0;
      do {
        pBVar2 = (ByteStreamOutArray *)operator_new(0x40);
        (pBVar2->super_ByteStreamOut).bit_buffer = 0;
        (pBVar2->super_ByteStreamOut).num_buffer = 0;
        (pBVar2->super_ByteStreamOut)._vptr_ByteStreamOut = (_func_int **)&PTR_putByte_0015f358;
        pUVar3 = (U8 *)malloc(0x1000);
        pBVar2->data = pUVar3;
        pBVar2->alloc = 0x1000;
        pBVar2->size = 0;
        pBVar2->curr = 0;
        (pBVar2->super_ByteStreamOut)._vptr_ByteStreamOut = (_func_int **)&PTR_putByte_0015f3f0;
        pBVar2[1].super_ByteStreamOut._vptr_ByteStreamOut = (_func_int **)0x0;
        this->outstream_Bytes[uVar7] = pBVar2;
        uVar7 = uVar7 + 1;
      } while (uVar6 != uVar7);
    }
    ppAVar4 = (ArithmeticEncoder **)operator_new__(uVar6 * 8);
    this->enc_Bytes = ppAVar4;
    if (this->number != 0) {
      uVar6 = 0;
      do {
        this_00 = (ArithmeticEncoder *)operator_new(0x30);
        ArithmeticEncoder::ArithmeticEncoder(this_00);
        this->enc_Bytes[uVar6] = this_00;
        uVar6 = uVar6 + 1;
      } while (uVar6 < this->number);
    }
  }
  else if (uVar6 != 0) {
    uVar6 = 0;
    do {
      (*(this->outstream_Bytes[uVar6]->super_ByteStreamOut)._vptr_ByteStreamOut[10])();
      uVar6 = uVar6 + 1;
    } while (uVar6 < this->number);
  }
  __n = (size_t)this->number;
  if (this->number != 0) {
    uVar6 = 0;
    do {
      ArithmeticEncoder::init(this->enc_Bytes[uVar6],(EVP_PKEY_CTX *)this->outstream_Bytes[uVar6]);
      uVar6 = uVar6 + 1;
      __n = (size_t)this->number;
    } while (uVar6 < __n);
  }
  if ((int)__n != 0) {
    memset(this->changed_Bytes,0,__n);
  }
  lVar5 = 0x38;
  do {
    *(undefined1 *)((long)this->contexts + lVar5 + -0x38) = 1;
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x98);
  context = *in_RDX;
  this->current_context = context;
  createAndInitModelsAndCompressors(this,context,(U8 *)ctx);
  return (int)CONCAT71(extraout_var,1);
}

Assistant:

BOOL LASwriteItemCompressed_BYTE14_v4::init(const U8* item, U32& context)
{
  U32 i;

  /* on the first init create outstreams and encoders */

  if (outstream_Bytes == 0)
  {
    /* create outstreams pointer array */

    outstream_Bytes = new ByteStreamOutArray*[number];

    /* create outstreams */

    if (IS_LITTLE_ENDIAN())
    {
      for (i = 0; i < number; i++)
      {
        outstream_Bytes[i] = new ByteStreamOutArrayLE();
      }
    }
    else
    {
      for (i = 0; i < number; i++)
      {
        outstream_Bytes[i] = new ByteStreamOutArrayBE();
      }
    }

    /* create encoder pointer array */

    enc_Bytes = new ArithmeticEncoder*[number];

    /* create layer encoders */

    for (i = 0; i < number; i++)
    {
      enc_Bytes[i] = new ArithmeticEncoder();
    }
  }
  else
  {
    /* otherwise just seek back */

    for (i = 0; i < number; i++)
    {
      outstream_Bytes[i]->seek(0);
    }
  }
  
  /* init layer encoders */

  for (i = 0; i < number; i++)
  {
    enc_Bytes[i]->init(outstream_Bytes[i]);
  }

  /* set changed booleans to FALSE */

  for (i = 0; i < number; i++)
  {
    changed_Bytes[i] = FALSE;
  }

  /* mark the four scanner channel contexts as unused */

  U32 c;
  for (c = 0; c < 4; c++)
  {
    contexts[c].unused = TRUE;
  }

  /* set scanner channel as current context */

  current_context = context; // all other items use context set by POINT14 writer

  /* create and init entropy models and integer compressors (and init context from item)  */

  createAndInitModelsAndCompressors(current_context, item);

  return TRUE;
}